

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecVec.h
# Opt level: O0

void Vec_VecSort(Vec_Vec_t *p,int fReverse)

{
  int fReverse_local;
  Vec_Vec_t *p_local;
  
  if (fReverse == 0) {
    qsort(p->pArray,(long)p->nSize,8,Vec_VecSortCompare1);
  }
  else {
    qsort(p->pArray,(long)p->nSize,8,Vec_VecSortCompare2);
  }
  return;
}

Assistant:

static inline void Vec_VecSort( Vec_Vec_t * p, int fReverse )
{
    if ( fReverse ) 
        qsort( (void *)p->pArray, p->nSize, sizeof(void *), 
                (int (*)(const void *, const void *)) Vec_VecSortCompare2 );
    else
        qsort( (void *)p->pArray, p->nSize, sizeof(void *), 
                (int (*)(const void *, const void *)) Vec_VecSortCompare1 );
}